

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::costSecondPartialDerivativeWRTStateSparsity
          (L2NormCost *this,SparsityStructure *stateSparsity)

{
  L2NormCostImplementation *pLVar1;
  SparsityStructure *pSVar2;
  
  pLVar1 = this->m_pimpl;
  pSVar2 = &(pLVar1->stateCost).m_emptySparsity;
  if ((pLVar1->stateCost).m_valid != false) {
    pSVar2 = &((pLVar1->stateCost).selector.
               super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_correspondingHessianSparsity;
  }
  SparsityStructure::operator=(stateSparsity,pSVar2);
  return true;
}

Assistant:

bool L2NormCost::costSecondPartialDerivativeWRTStateSparsity(SparsityStructure &stateSparsity)
        {
            stateSparsity = m_pimpl->stateCost.getHessianSparsity();
            return true;
        }